

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graphical_model.h
# Opt level: O3

variable_order_t * __thiscall
merlin::graphical_model::order2
          (variable_order_t *__return_storage_ptr__,graphical_model *this,OrderMethod ord_type,
          vector<bool,_std::allocator<bool>_> *var_types)

{
  iterator iVar1;
  unsigned_long uVar2;
  undefined8 uVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  pointer pmVar7;
  index *piVar8;
  _Base_ptr p_Var9;
  pointer peVar10;
  _Rb_tree_node_base *p_Var11;
  _Rb_tree_node_base *p_Var12;
  pointer peVar13;
  pointer pmVar14;
  ulong uVar15;
  pointer puVar16;
  const_iterator ci;
  pointer pvVar17;
  _Rb_tree_header *p_Var18;
  _Rb_tree<unsigned_long,unsigned_long,std::_Identity<unsigned_long>,std::less<unsigned_long>,std::allocator<unsigned_long>>
  *this_00;
  _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
  *p_Var19;
  ulong __n;
  long lVar20;
  size_t sVar21;
  index *piVar22;
  bool bVar23;
  pair<std::_Rb_tree_iterator<unsigned_long>,_std::_Rb_tree_iterator<unsigned_long>_> pVar24;
  size_t cand;
  vector<unsigned_long,_std::allocator<unsigned_long>_> candidates;
  set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> neighbors;
  vector<unsigned_long,_std::allocator<unsigned_long>_> simplicial;
  my_set<merlin::edge_id> nlist;
  vector<int,_std::allocator<int>_> scores;
  set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> to_fix;
  set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> sum_vars;
  set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> map_vars;
  vector<merlin::variable_set,_std::allocator<merlin::variable_set>_> adj;
  graph G;
  unsigned_long local_270;
  vector<unsigned_long,std::allocator<unsigned_long>> *local_268;
  OrderMethod local_25c;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_258;
  _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
  local_240;
  vector<bool,_std::allocator<bool>_> *local_210;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_208;
  my_set<merlin::edge_id> local_1f0;
  vector<int,_std::allocator<int>_> local_1d0;
  graphical_model *local_1b8;
  unsigned_long local_1b0;
  _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
  local_1a8;
  _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
  local_178;
  _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
  local_148;
  vector<merlin::variable_set,_std::allocator<merlin::variable_set>_> local_118;
  undefined1 local_100 [96];
  unsigned_long *local_a0;
  _Elt_pointer local_90;
  
  (__return_storage_ptr__->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_268 = (vector<unsigned_long,std::allocator<unsigned_long>> *)__return_storage_ptr__;
  local_25c.t_ = ord_type.t_;
  local_210 = var_types;
  graph::graph((graph *)local_100,
               (long)(this->m_vadj).
                     super__Vector_base<merlin::my_set<unsigned_long>,_std::allocator<merlin::my_set<unsigned_long>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)(this->m_vadj).
                     super__Vector_base<merlin::my_set<unsigned_long>,_std::allocator<merlin::my_set<unsigned_long>_>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 5);
  mrf(&local_118,this);
  pmVar7 = (this->m_vadj).
           super__Vector_base<merlin::my_set<unsigned_long>,_std::allocator<merlin::my_set<unsigned_long>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pmVar14 = (this->m_vadj).
            super__Vector_base<merlin::my_set<unsigned_long>,_std::allocator<merlin::my_set<unsigned_long>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if (pmVar14 == pmVar7) {
    __n = 0;
  }
  else {
    uVar15 = 0;
    do {
      puVar16 = local_118.
                super__Vector_base<merlin::variable_set,_std::allocator<merlin::variable_set>_>.
                _M_impl.super__Vector_impl_data._M_start[uVar15].m_v.
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start;
      if (local_118.super__Vector_base<merlin::variable_set,_std::allocator<merlin::variable_set>_>.
          _M_impl.super__Vector_impl_data._M_start[uVar15].m_v.
          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_finish != puVar16) {
        pvVar17 = local_118.
                  super__Vector_base<merlin::variable_set,_std::allocator<merlin::variable_set>_>.
                  _M_impl.super__Vector_impl_data._M_start + uVar15;
        lVar20 = 0;
        do {
          graph::add_edge((graph *)local_100,uVar15,puVar16[lVar20]);
          lVar20 = lVar20 + 1;
          puVar16 = (pvVar17->m_v).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                    ._M_impl.super__Vector_impl_data._M_start;
        } while (lVar20 != (long)(pvVar17->m_v).
                                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                 _M_impl.super__Vector_impl_data._M_finish - (long)puVar16 >> 3);
        pmVar7 = (this->m_vadj).
                 super__Vector_base<merlin::my_set<unsigned_long>,_std::allocator<merlin::my_set<unsigned_long>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pmVar14 = (this->m_vadj).
                  super__Vector_base<merlin::my_set<unsigned_long>,_std::allocator<merlin::my_set<unsigned_long>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      }
      uVar15 = uVar15 + 1;
      __n = (long)pmVar14 - (long)pmVar7 >> 5;
    } while (uVar15 < __n);
  }
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::reserve
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_268,__n);
  local_178._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_178._M_impl.super__Rb_tree_header._M_header;
  local_178._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_178._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_178._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_148._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_148._M_impl.super__Rb_tree_header._M_header;
  local_148._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_148._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_148._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_240._M_impl._0_8_ = (index *)0x0;
  local_178._M_impl.super__Rb_tree_header._M_header._M_right =
       local_178._M_impl.super__Rb_tree_header._M_header._M_left;
  local_148._M_impl.super__Rb_tree_header._M_header._M_right =
       local_148._M_impl.super__Rb_tree_header._M_header._M_left;
  if (__n != 0) {
    do {
      piVar8 = (index *)(local_240._M_impl._0_8_ + 0x3f);
      if (-1 < (long)local_240._M_impl._0_8_) {
        piVar8 = (index *)local_240._M_impl._0_8_;
      }
      this_00 = (_Rb_tree<unsigned_long,unsigned_long,std::_Identity<unsigned_long>,std::less<unsigned_long>,std::allocator<unsigned_long>>
                 *)&local_178;
      if (((local_210->super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data.
           _M_start.super__Bit_iterator_base._M_p
           [((long)piVar8 >> 6) +
            (ulong)((local_240._M_impl._0_8_ & 0x800000000000003f) < 0x8000000000000001) +
            0xffffffffffffffff] >> (local_240._M_impl._0_8_ & 0x3f) & 1) != 0) {
        this_00 = (_Rb_tree<unsigned_long,unsigned_long,std::_Identity<unsigned_long>,std::less<unsigned_long>,std::allocator<unsigned_long>>
                   *)&local_148;
      }
      std::
      _Rb_tree<unsigned_long,unsigned_long,std::_Identity<unsigned_long>,std::less<unsigned_long>,std::allocator<unsigned_long>>
      ::_M_insert_unique<unsigned_long_const&>(this_00,(unsigned_long *)&local_240);
      local_240._M_impl._0_8_ = local_240._M_impl._0_8_ + 1;
    } while ((ulong)local_240._M_impl._0_8_ < __n);
  }
  std::vector<int,_std::allocator<int>_>::vector(&local_1d0,__n,(allocator_type *)&local_240);
  if (__n != 0) {
    sVar21 = 0;
    do {
      iVar4 = order_score(this,(graph *)local_100,sVar21,local_25c);
      local_1d0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start[sVar21] = iVar4;
      sVar21 = sVar21 + 1;
    } while (__n != sVar21);
  }
  local_1b8 = this;
  do {
    if ((int)__n == 0) break;
    local_258.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start = (unsigned_long *)0x0;
    local_258.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish = (unsigned_long *)0x0;
    local_258.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (unsigned_long *)0x0;
    local_208.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (unsigned_long *)0x0;
    local_208.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start = (unsigned_long *)0x0;
    local_208.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish = (unsigned_long *)0x0;
    p_Var19 = &local_178;
    if (local_178._M_impl.super__Rb_tree_header._M_node_count == 0) {
      p_Var19 = &local_148;
    }
    p_Var9 = (p_Var19->_M_impl).super__Rb_tree_header._M_header._M_left;
    p_Var19 = &local_178;
    if (local_178._M_impl.super__Rb_tree_header._M_node_count == 0) {
      p_Var19 = &local_148;
    }
    p_Var18 = &(p_Var19->_M_impl).super__Rb_tree_header;
    if ((_Rb_tree_header *)p_Var9 == p_Var18) {
LAB_001735c7:
      bVar23 = true;
    }
    else {
      iVar4 = 0x7fffffff;
      do {
        piVar8 = (index *)(long)(int)p_Var9[1]._M_color;
        iVar5 = local_1d0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start[(long)piVar8];
        if (iVar5 == 0) {
          if (local_208.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_finish ==
              local_208.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            local_240._M_impl._0_8_ = piVar8;
            std::vector<unsigned_long,_std::allocator<unsigned_long>_>::
            _M_realloc_insert<unsigned_long>
                      (&local_208,
                       (iterator)
                       local_208.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                       _M_impl.super__Vector_impl_data._M_finish,(unsigned_long *)&local_240);
          }
          else {
            *local_208.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_finish = (unsigned_long)piVar8;
            local_208.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 local_208.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                 .super__Vector_impl_data._M_finish + 1;
            local_240._M_impl._0_8_ = piVar8;
          }
        }
        else if (iVar5 < iVar4) {
          if (local_258.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_finish !=
              local_258.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start) {
            local_258.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 local_258.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                 .super__Vector_impl_data._M_start;
          }
          iVar4 = iVar5;
          if (local_258.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_finish ==
              local_258.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            local_240._M_impl._0_8_ = piVar8;
            std::vector<unsigned_long,_std::allocator<unsigned_long>_>::
            _M_realloc_insert<unsigned_long>
                      (&local_258,
                       (iterator)
                       local_258.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                       _M_impl.super__Vector_impl_data._M_finish,(unsigned_long *)&local_240);
          }
          else {
            *local_258.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_finish = (unsigned_long)piVar8;
            local_258.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 local_258.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                 .super__Vector_impl_data._M_finish + 1;
            local_240._M_impl._0_8_ = piVar8;
          }
        }
        else if (iVar5 == iVar4) {
          if (local_258.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_finish ==
              local_258.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            local_240._M_impl._0_8_ = piVar8;
            std::vector<unsigned_long,_std::allocator<unsigned_long>_>::
            _M_realloc_insert<unsigned_long>
                      (&local_258,
                       (iterator)
                       local_258.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                       _M_impl.super__Vector_impl_data._M_finish,(unsigned_long *)&local_240);
          }
          else {
            *local_258.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_finish = (unsigned_long)piVar8;
            local_258.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 local_258.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                 .super__Vector_impl_data._M_finish + 1;
            local_240._M_impl._0_8_ = piVar8;
          }
        }
        p_Var9 = (_Base_ptr)std::_Rb_tree_increment(p_Var9);
      } while ((_Rb_tree_header *)p_Var9 != p_Var18);
      bVar23 = iVar4 == 0x7fffffff;
      puVar16 = local_208.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start;
      if (local_208.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start !=
          local_208.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        do {
          local_1f0.super_my_vector<merlin::edge_id>.
          super_vector<merlin::edge_id,_std::allocator<merlin::edge_id>_>.
          super__Vector_base<merlin::edge_id,_std::allocator<merlin::edge_id>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)*puVar16;
          iVar1._M_current = *(unsigned_long **)(local_268 + 8);
          if (iVar1._M_current == *(unsigned_long **)(local_268 + 0x10)) {
            std::vector<unsigned_long,std::allocator<unsigned_long>>::
            _M_realloc_insert<unsigned_long_const&>(local_268,iVar1,(unsigned_long *)&local_1f0);
          }
          else {
            *iVar1._M_current =
                 (unsigned_long)
                 local_1f0.super_my_vector<merlin::edge_id>.
                 super_vector<merlin::edge_id,_std::allocator<merlin::edge_id>_>.
                 super__Vector_base<merlin::edge_id,_std::allocator<merlin::edge_id>_>._M_impl.
                 super__Vector_impl_data._M_start;
            *(unsigned_long **)(local_268 + 8) = iVar1._M_current + 1;
          }
          my_set<merlin::edge_id>::my_set
                    ((my_set<merlin::edge_id> *)&local_240,
                     (my_set<merlin::edge_id> *)
                     (local_100._0_8_ +
                     local_1f0.super_my_vector<merlin::edge_id>.
                     super_vector<merlin::edge_id,_std::allocator<merlin::edge_id>_>.
                     super__Vector_base<merlin::edge_id,_std::allocator<merlin::edge_id>_>._M_impl.
                     super__Vector_impl_data._M_start * 0x20));
          for (piVar8 = (index *)local_240._M_impl._0_8_;
              piVar8 != (index *)CONCAT44(local_240._M_impl.super__Rb_tree_header._M_header._4_4_,
                                          local_240._M_impl.super__Rb_tree_header._M_header._M_color
                                         ); piVar8 = piVar8 + 4) {
            graph::remove_edge((graph *)local_100,*piVar8,piVar8[1]);
          }
          local_1a8._M_impl._0_8_ =
               local_1f0.super_my_vector<merlin::edge_id>.
               super_vector<merlin::edge_id,_std::allocator<merlin::edge_id>_>.
               super__Vector_base<merlin::edge_id,_std::allocator<merlin::edge_id>_>._M_impl.
               super__Vector_impl_data._M_start;
          if (local_a0 == local_90 + -1) {
            std::deque<unsigned_long,std::allocator<unsigned_long>>::
            _M_push_back_aux<unsigned_long_const&>
                      ((deque<unsigned_long,std::allocator<unsigned_long>> *)(local_100 + 0x30),
                       (unsigned_long *)&local_1a8);
          }
          else {
            *local_a0 = (unsigned_long)
                        local_1f0.super_my_vector<merlin::edge_id>.
                        super_vector<merlin::edge_id,_std::allocator<merlin::edge_id>_>.
                        super__Vector_base<merlin::edge_id,_std::allocator<merlin::edge_id>_>.
                        _M_impl.super__Vector_impl_data._M_start;
            local_a0 = local_a0 + 1;
          }
          local_1d0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start[(long)local_1f0.super_my_vector<merlin::edge_id>.
                         super_vector<merlin::edge_id,_std::allocator<merlin::edge_id>_>.
                         super__Vector_base<merlin::edge_id,_std::allocator<merlin::edge_id>_>.
                         _M_impl.super__Vector_impl_data._M_start] = 0x7fffffff;
          peVar10 = (pointer)((long)&local_1f0.super_my_vector<merlin::edge_id>.
                                     super_vector<merlin::edge_id,_std::allocator<merlin::edge_id>_>
                                     .
                                     super__Vector_base<merlin::edge_id,_std::allocator<merlin::edge_id>_>
                                     ._M_impl.super__Vector_impl_data._M_start[1].ridx + 7);
          if (-1 < (long)local_1f0.super_my_vector<merlin::edge_id>.
                         super_vector<merlin::edge_id,_std::allocator<merlin::edge_id>_>.
                         super__Vector_base<merlin::edge_id,_std::allocator<merlin::edge_id>_>.
                         _M_impl.super__Vector_impl_data._M_start) {
            peVar10 = local_1f0.super_my_vector<merlin::edge_id>.
                      super_vector<merlin::edge_id,_std::allocator<merlin::edge_id>_>.
                      super__Vector_base<merlin::edge_id,_std::allocator<merlin::edge_id>_>._M_impl.
                      super__Vector_impl_data._M_start;
          }
          if (((local_210->super__Bvector_base<std::allocator<bool>_>)._M_impl.
               super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
               [((long)peVar10 >> 6) +
                (ulong)(((ulong)local_1f0.super_my_vector<merlin::edge_id>.
                                super_vector<merlin::edge_id,_std::allocator<merlin::edge_id>_>.
                                super__Vector_base<merlin::edge_id,_std::allocator<merlin::edge_id>_>
                                ._M_impl.super__Vector_impl_data._M_start & 0x800000000000003f) <
                       0x8000000000000001) + 0xffffffffffffffff] >>
               ((ulong)local_1f0.super_my_vector<merlin::edge_id>.
                       super_vector<merlin::edge_id,_std::allocator<merlin::edge_id>_>.
                       super__Vector_base<merlin::edge_id,_std::allocator<merlin::edge_id>_>._M_impl
                       .super__Vector_impl_data._M_start & 0x3f) & 1) == 0) {
            pVar24 = std::
                     _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
                     ::equal_range(&local_178,(key_type *)&local_1f0);
            p_Var19 = &local_178;
          }
          else {
            pVar24 = std::
                     _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
                     ::equal_range(&local_148,(key_type *)&local_1f0);
            p_Var19 = &local_148;
          }
          std::
          _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
          ::_M_erase_aux(p_Var19,(_Base_ptr)pVar24.first._M_node,(_Base_ptr)pVar24.second._M_node);
          if ((index *)local_240._M_impl._0_8_ != (index *)0x0) {
            operator_delete((void *)local_240._M_impl._0_8_);
          }
          __n = (ulong)((int)__n - 1);
          puVar16 = puVar16 + 1;
        } while (puVar16 !=
                 local_208.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                 .super__Vector_impl_data._M_finish);
      }
      if (iVar4 == 0x7fffffff) goto LAB_001735c7;
      iVar4 = (int)((ulong)((long)local_258.
                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                  _M_impl.super__Vector_impl_data._M_finish -
                           (long)local_258.
                                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                 _M_impl.super__Vector_impl_data._M_start) >> 3);
      if (iVar4 < 1) {
        __assert_fail("imax > 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/radum2275[P]merlin/include/util.h"
                      ,0x91,"int merlin::randi2(int)");
      }
      iVar5 = rand();
      iVar6 = (int)((double)iVar4 * ((double)iVar5 / 2147483647.0));
      iVar5 = iVar4 + -1;
      if (iVar6 < iVar4) {
        iVar5 = iVar6;
      }
      local_270 = local_258.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                  _M_impl.super__Vector_impl_data._M_start[iVar5];
      iVar1._M_current = *(unsigned_long **)(local_268 + 8);
      if (iVar1._M_current == *(unsigned_long **)(local_268 + 0x10)) {
        std::vector<unsigned_long,std::allocator<unsigned_long>>::
        _M_realloc_insert<unsigned_long_const&>(local_268,iVar1,&local_270);
      }
      else {
        *iVar1._M_current = local_270;
        *(unsigned_long **)(local_268 + 8) = iVar1._M_current + 1;
      }
      p_Var18 = &local_240._M_impl.super__Rb_tree_header;
      my_set<merlin::edge_id>::my_set
                (&local_1f0,(my_set<merlin::edge_id> *)(local_100._0_8_ + local_270 * 0x20));
      local_240._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      local_240._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      local_240._M_impl.super__Rb_tree_header._M_node_count = 0;
      local_240._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var18->_M_header;
      local_240._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var18->_M_header;
      if (local_1f0.super_my_vector<merlin::edge_id>.
          super_vector<merlin::edge_id,_std::allocator<merlin::edge_id>_>.
          super__Vector_base<merlin::edge_id,_std::allocator<merlin::edge_id>_>._M_impl.
          super__Vector_impl_data._M_start !=
          local_1f0.super_my_vector<merlin::edge_id>.
          super_vector<merlin::edge_id,_std::allocator<merlin::edge_id>_>.
          super__Vector_base<merlin::edge_id,_std::allocator<merlin::edge_id>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        peVar10 = local_1f0.super_my_vector<merlin::edge_id>.
                  super_vector<merlin::edge_id,_std::allocator<merlin::edge_id>_>.
                  super__Vector_base<merlin::edge_id,_std::allocator<merlin::edge_id>_>._M_impl.
                  super__Vector_impl_data._M_finish;
        piVar22 = &(local_1f0.super_my_vector<merlin::edge_id>.
                    super_vector<merlin::edge_id,_std::allocator<merlin::edge_id>_>.
                    super__Vector_base<merlin::edge_id,_std::allocator<merlin::edge_id>_>._M_impl.
                    super__Vector_impl_data._M_start)->second;
        do {
          if ((((edge_id *)(piVar22 + -1))->first == local_270) &&
             (*piVar22 != ((edge_id *)(piVar22 + -1))->first)) {
            std::
            _Rb_tree<unsigned_long,unsigned_long,std::_Identity<unsigned_long>,std::less<unsigned_long>,std::allocator<unsigned_long>>
            ::_M_insert_unique<unsigned_long_const&>
                      ((_Rb_tree<unsigned_long,unsigned_long,std::_Identity<unsigned_long>,std::less<unsigned_long>,std::allocator<unsigned_long>>
                        *)&local_240,piVar22);
            peVar10 = local_1f0.super_my_vector<merlin::edge_id>.
                      super_vector<merlin::edge_id,_std::allocator<merlin::edge_id>_>.
                      super__Vector_base<merlin::edge_id,_std::allocator<merlin::edge_id>_>._M_impl.
                      super__Vector_impl_data._M_finish;
          }
          peVar13 = (pointer)(piVar22 + 3);
          piVar22 = piVar22 + 4;
          p_Var12 = local_240._M_impl.super__Rb_tree_header._M_header._M_left;
        } while (peVar13 != peVar10);
        for (; p_Var11 = p_Var12, (_Rb_tree_header *)p_Var12 != p_Var18;
            p_Var12 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var12)) {
          while (p_Var11 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var11),
                (_Rb_tree_header *)p_Var11 != p_Var18) {
            graph::add_edge((graph *)local_100,*(index *)(p_Var12 + 1),*(index *)(p_Var11 + 1));
          }
        }
      }
      std::
      _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
      ::_Rb_tree(&local_1a8,&local_240);
      p_Var9 = local_240._M_impl.super__Rb_tree_header._M_header._M_left;
      if ((_Rb_tree_header *)local_240._M_impl.super__Rb_tree_header._M_header._M_left != p_Var18) {
        do {
          uVar3 = local_100._0_8_;
          uVar2 = *(unsigned_long *)(p_Var9 + 1);
          peVar10 = (((pointer)(local_100._0_8_ + uVar2 * 0x20))->super_my_vector<merlin::edge_id>).
                    super_vector<merlin::edge_id,_std::allocator<merlin::edge_id>_>.
                    super__Vector_base<merlin::edge_id,_std::allocator<merlin::edge_id>_>._M_impl.
                    super__Vector_impl_data._M_start;
          peVar13 = (((pointer)(local_100._0_8_ + uVar2 * 0x20))->super_my_vector<merlin::edge_id>).
                    super_vector<merlin::edge_id,_std::allocator<merlin::edge_id>_>.
                    super__Vector_base<merlin::edge_id,_std::allocator<merlin::edge_id>_>._M_impl.
                    super__Vector_impl_data._M_finish;
          if (peVar10 != peVar13) {
            piVar22 = &peVar10->second;
            do {
              if ((((edge_id *)(piVar22 + -1))->first == uVar2) && (uVar2 != *piVar22)) {
                std::
                _Rb_tree<unsigned_long,unsigned_long,std::_Identity<unsigned_long>,std::less<unsigned_long>,std::allocator<unsigned_long>>
                ::_M_insert_unique<unsigned_long_const&>
                          ((_Rb_tree<unsigned_long,unsigned_long,std::_Identity<unsigned_long>,std::less<unsigned_long>,std::allocator<unsigned_long>>
                            *)&local_1a8,piVar22);
                peVar13 = (((pointer)(uVar3 + uVar2 * 0x20))->super_my_vector<merlin::edge_id>).
                          super_vector<merlin::edge_id,_std::allocator<merlin::edge_id>_>.
                          super__Vector_base<merlin::edge_id,_std::allocator<merlin::edge_id>_>.
                          _M_impl.super__Vector_impl_data._M_finish;
              }
              peVar10 = (pointer)(piVar22 + 3);
              piVar22 = piVar22 + 4;
            } while (peVar10 != peVar13);
          }
          p_Var9 = (_Base_ptr)std::_Rb_tree_increment(p_Var9);
        } while ((_Rb_tree_header *)p_Var9 != &local_240._M_impl.super__Rb_tree_header);
      }
      pVar24 = std::
               _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
               ::equal_range(&local_1a8,&local_270);
      std::
      _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
      ::_M_erase_aux(&local_1a8,(_Base_ptr)pVar24.first._M_node,(_Base_ptr)pVar24.second._M_node);
      for (peVar10 = local_1f0.super_my_vector<merlin::edge_id>.
                     super_vector<merlin::edge_id,_std::allocator<merlin::edge_id>_>.
                     super__Vector_base<merlin::edge_id,_std::allocator<merlin::edge_id>_>._M_impl.
                     super__Vector_impl_data._M_start;
          peVar10 !=
          local_1f0.super_my_vector<merlin::edge_id>.
          super_vector<merlin::edge_id,_std::allocator<merlin::edge_id>_>.
          super__Vector_base<merlin::edge_id,_std::allocator<merlin::edge_id>_>._M_impl.
          super__Vector_impl_data._M_finish; peVar10 = peVar10 + 1) {
        graph::remove_edge((graph *)local_100,peVar10->first,peVar10->second);
      }
      local_1b0 = local_270;
      if (local_a0 == local_90 + -1) {
        std::deque<unsigned_long,std::allocator<unsigned_long>>::
        _M_push_back_aux<unsigned_long_const&>
                  ((deque<unsigned_long,std::allocator<unsigned_long>> *)(local_100 + 0x30),
                   &local_1b0);
      }
      else {
        *local_a0 = local_270;
        local_a0 = local_a0 + 1;
      }
      local_1d0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start[local_270] = 0x7fffffff;
      uVar15 = local_270 + 0x3f;
      if (-1 < (long)local_270) {
        uVar15 = local_270;
      }
      if (((local_210->super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data.
           _M_start.super__Bit_iterator_base._M_p
           [((long)uVar15 >> 6) +
            (ulong)((local_270 & 0x800000000000003f) < 0x8000000000000001) + 0xffffffffffffffff] >>
           (local_270 & 0x3f) & 1) == 0) {
        pVar24 = std::
                 _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
                 ::equal_range(&local_178,&local_270);
        p_Var19 = &local_178;
      }
      else {
        pVar24 = std::
                 _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
                 ::equal_range(&local_148,&local_270);
        p_Var19 = &local_148;
      }
      std::
      _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
      ::_M_erase_aux(p_Var19,(_Base_ptr)pVar24.first._M_node,(_Base_ptr)pVar24.second._M_node);
      for (p_Var9 = local_1a8._M_impl.super__Rb_tree_header._M_header._M_left;
          (_Rb_tree_header *)p_Var9 != &local_1a8._M_impl.super__Rb_tree_header;
          p_Var9 = (_Base_ptr)std::_Rb_tree_increment(p_Var9)) {
        sVar21 = *(size_t *)(p_Var9 + 1);
        iVar4 = order_score(local_1b8,(graph *)local_100,sVar21,local_25c);
        local_1d0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start[sVar21] = iVar4;
      }
      std::
      _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
      ::~_Rb_tree(&local_1a8);
      std::
      _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
      ::~_Rb_tree(&local_240);
      if (local_1f0.super_my_vector<merlin::edge_id>.
          super_vector<merlin::edge_id,_std::allocator<merlin::edge_id>_>.
          super__Vector_base<merlin::edge_id,_std::allocator<merlin::edge_id>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_1f0.super_my_vector<merlin::edge_id>.
                        super_vector<merlin::edge_id,_std::allocator<merlin::edge_id>_>.
                        super__Vector_base<merlin::edge_id,_std::allocator<merlin::edge_id>_>.
                        _M_impl.super__Vector_impl_data._M_start);
      }
      __n = (ulong)((int)__n - 1);
    }
    if (local_208.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start != (unsigned_long *)0x0) {
      operator_delete(local_208.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                      _M_impl.super__Vector_impl_data._M_start);
    }
    if (local_258.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start != (unsigned_long *)0x0) {
      operator_delete(local_258.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                      _M_impl.super__Vector_impl_data._M_start);
    }
  } while (!bVar23);
  if (local_1d0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_1d0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  std::
  _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
  ::~_Rb_tree(&local_148);
  std::
  _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
  ::~_Rb_tree(&local_178);
  std::vector<merlin::variable_set,_std::allocator<merlin::variable_set>_>::~vector(&local_118);
  graph::~graph((graph *)local_100);
  return (variable_order_t *)local_268;
}

Assistant:

variable_order_t order2(OrderMethod ord_type, std::vector<bool> var_types) const {

		// variable order to be computed
		variable_order_t order;

		// create a temporary graph
		graph G(nvar());
		std::vector<variable_set> adj = mrf();
		for (size_t i = 0; i < nvar(); ++i) {
			variable_set& vs = adj[i];
			for (variable_set::const_iterator vi = vs.begin();
					vi != vs.end(); ++vi) {
				size_t j = _vindex(*vi);
				G.add_edge(i, j);
			}
		}

		// reserve space for the order
		size_t n = nvar();
		order.reserve(n);

		// identify SUM and MAP variables
		std::set<size_t> sum_vars, map_vars;
		for (size_t i = 0; i < n; ++i) {
			if (var_types[i] == false) sum_vars.insert(i);
			else map_vars.insert(i);
		}

		// keeps track of node scores
		std::vector<int> scores(n);
		for (size_t i = 0; i < n; ++i) {
			scores[i] = order_score(G, i, ord_type);
		}

		// eliminate nodes until all gone
		int min_score = -1, num_nodes = n;
		size_t width = 0;
		while (num_nodes != 0) {

			// keeps track of minimal score nodes
			std::vector<size_t> candidates; // minimal score of 1 or higher
			std::vector<size_t> simplicial; // simplicial nodes (score 0)

			min_score = std::numeric_limits<int>::max();

			// check if there are SUM vars left to eliminate
			std::set<size_t>::iterator start, stop;
			if (sum_vars.empty() == false) { // yes
				start = sum_vars.begin();
				stop = sum_vars.end();
			} else { // done, move to MAP vars
				start = map_vars.begin();
				stop = map_vars.end();
			}
			for (std::set<size_t>::iterator si = start; si != stop; ++si) {
				int v = *si;
				if (scores[v] == 0) { // score 0
					simplicial.push_back(v);
				} else if (scores[v] < min_score) { // new, lower score (but greater 0)
					min_score = scores[v];
					candidates.clear();
					candidates.push_back(v);
				} else if (scores[v] == min_score) { // current min. found again
					candidates.push_back(v);
				}
			}

			// eliminate all nodes with score=0 -> no edges will have to be added
			for (std::vector<size_t>::iterator it = simplicial.begin();
					it != simplicial.end(); ++it) {
				size_t v = (*it);
				order.push_back(v);
				--num_nodes;
				my_set<edge_id> temp = G.neighbors(v);
				width = std::max(width, temp.size());
				for (my_set<edge_id>::const_iterator ci = temp.begin();
						ci != temp.end(); ++ci) {
					size_t i = ci->first, j = ci->second;
					G.remove_edge(i, j);
				}
				G.remove_node(v); // and adj edges
				scores[v] = std::numeric_limits<int>::max();
				if (var_types[v] == false) sum_vars.erase(v);
				else map_vars.erase(v);
			}

			// anything left to eliminate? If not, we are done!
			if (min_score == std::numeric_limits<int>::max()) {
				break;
			}

			// Pick one of the minimal score nodes (with score >= 1),
			// breaking ties randomly
			size_t cand = candidates[randi2(candidates.size())];
			//size_t cand = candidates[0]; // first candidate in list (lexicograhically)
			order.push_back(cand);
			--num_nodes;

			// remember it's neighbors, to be used later
			my_set<edge_id> nlist = G.neighbors(cand);
			std::set<size_t> neighbors;
			for (my_set<edge_id>::const_iterator ci = nlist.begin();
					ci != nlist.end(); ++ci) {
				if (ci->first == cand && ci->second != cand)
					neighbors.insert(ci->second);
			}

			// connect neighbors in primal graph
			std::set<size_t>::iterator it1, it2;
			for (it1 = neighbors.begin(); it1 != neighbors.end(); ++it1) {
				it2 = it1;
				while (++it2 != neighbors.end()) {
					size_t i = *it1, j = *it2;
					G.add_edge(i, j);
				}
			}

			// compute candidates for score update (node's neighbors and their neighbors)
			width = std::max(width, neighbors.size());
			std::set<size_t> to_fix(neighbors);
			for (std::set<size_t>::const_iterator it = neighbors.begin();
					it != neighbors.end(); ++it) {
				size_t v = (*it);
				const my_set<edge_id>& temp = G.neighbors(v);
				for (my_set<edge_id>::const_iterator ci = temp.begin();
						ci != temp.end(); ++ci) {
					if (ci->first == v && v != ci->second)
						to_fix.insert(ci->second);
				}
			}
			to_fix.erase(cand);

			// remove node from primal graph
			for (my_set<edge_id>::const_iterator ci = nlist.begin();
					ci != nlist.end(); ++ci) {
				size_t i = ci->first, j = ci->second;
				G.remove_edge(i, j);
			}
			G.remove_node(cand); // and adj edges
			scores[cand] = std::numeric_limits<int>::max(); // tag score
			if (var_types[cand] == false) sum_vars.erase(cand);
			else map_vars.erase(cand);

			// update scores in primal graph (candidate nodes computed earlier)
			for (std::set<size_t>::const_iterator it = to_fix.begin();
					it != to_fix.end(); ++it) {
				size_t v = (*it);
				scores[v] = order_score(G, v, ord_type);
			}
		}

		return order;
	}